

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseInterpolationExpr(Parser *this)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  pointer pcVar4;
  CompileContext *pCVar5;
  undefined4 *puVar6;
  pointer *__ptr;
  Parser *in_RSI;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> interpolated;
  Token token;
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_78;
  TokenType local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  _Alloc_hider local_50;
  undefined1 local_48 [24];
  
  local_60 = (in_RSI->m_previous).type;
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_48;
  pcVar1 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (in_RSI->m_previous).lexeme._M_string_length);
  local_48._20_2_ = (in_RSI->m_previous).col;
  local_48._16_4_ = (in_RSI->m_previous).line;
  puVar3 = (undefined8 *)operator_new(0x28);
  pcVar1 = local_90 + 0x10;
  pcVar4 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  local_90._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar4,pcVar4 + (in_RSI->m_previous).lexeme._M_string_length);
  *puVar3 = &PTR__StringExpr_001297e0;
  puVar3[1] = puVar3 + 3;
  if ((pointer)local_90._0_8_ == pcVar1) {
    puVar3[3] = local_90._16_8_;
    puVar3[4] = aStack_78._0_8_;
  }
  else {
    puVar3[1] = local_90._0_8_;
    puVar3[3] = local_90._16_8_;
  }
  puVar3[2] = local_90._8_8_;
  parseExpr((Parser *)local_98);
  if ((in_RSI->m_current).type == INTERPOLATION) {
    advance(in_RSI);
    parseInterpolationExpr((Parser *)local_90);
    pcVar4 = (pointer)local_90._0_8_;
  }
  else {
    local_90._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Expected end of string interpolation","");
    expect(in_RSI,STRING,(string *)local_90);
    if ((pointer)local_90._0_8_ != pcVar1) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
    pcVar4 = (pointer)operator_new(0x28);
    pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    local_90._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
    *(undefined ***)pcVar4 = &PTR__StringExpr_001297e0;
    *(pointer *)(pcVar4 + 8) = pcVar4 + 0x18;
    if ((pointer)local_90._0_8_ == pcVar1) {
      *(undefined8 *)(pcVar4 + 0x18) = local_90._16_8_;
      *(undefined8 *)(pcVar4 + 0x20) = aStack_78._0_8_;
    }
    else {
      *(undefined8 *)(pcVar4 + 8) = local_90._0_8_;
      *(undefined8 *)(pcVar4 + 0x18) = local_90._16_8_;
    }
    *(undefined8 *)(pcVar4 + 0x10) = local_90._8_8_;
  }
  pCVar5 = (CompileContext *)operator_new(0x50);
  if (local_58 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48) {
    aStack_78._8_4_ = local_48._8_4_;
    aStack_78._12_4_ = local_48._12_4_;
    local_90._8_8_ = &aStack_78;
  }
  else {
    local_90._8_8_ = local_58;
  }
  aStack_78._M_allocated_capacity._4_4_ = local_48._4_4_;
  aStack_78._M_allocated_capacity._0_4_ = local_48._0_4_;
  (pCVar5->m_source)._M_dataplus._M_p = (pointer)&PTR__InterpolationExpr_001298b8;
  (pCVar5->m_source)._M_string_length = (size_type)puVar3;
  (pCVar5->m_source).field_2._M_allocated_capacity = (size_type)local_98;
  *(pointer *)((long)&(pCVar5->m_source).field_2 + 8) = pcVar4;
  *(TokenType *)&(pCVar5->m_options).m_filename._M_dataplus._M_p = local_60;
  puVar6 = (undefined4 *)((long)&(pCVar5->m_options).m_filename.field_2 + 8);
  (pCVar5->m_options).m_filename._M_string_length = (size_type)puVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._8_8_ == &aStack_78) {
    *puVar6 = local_48._0_4_;
    *(undefined4 *)((long)&(pCVar5->m_options).m_filename.field_2 + 0xc) = local_48._4_4_;
    *(undefined4 *)
     &(pCVar5->m_options).m_programArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = aStack_78._8_4_;
    *(undefined4 *)
     ((long)&(pCVar5->m_options).m_programArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = aStack_78._12_4_;
  }
  else {
    (pCVar5->m_options).m_filename._M_string_length = local_90._8_8_;
    *(undefined8 *)((long)&(pCVar5->m_options).m_filename.field_2 + 8) = aStack_78._0_8_;
  }
  (pCVar5->m_options).m_filename.field_2._M_allocated_capacity = (size_type)local_50._M_p;
  *(undefined2 *)
   ((long)&(pCVar5->m_options).m_programArgs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = local_48._20_2_;
  *(undefined4 *)
   &(pCVar5->m_options).m_programArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_48._16_4_;
  this->m_context = pCVar5;
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseInterpolationExpr() {
        Token token = m_previous;
        std::unique_ptr<StringExpr> start = std::make_unique<StringExpr>(m_previous.lexeme);
        std::unique_ptr<Expr> interpolated = parseExpr();
        std::unique_ptr<Expr> end;

        if (consume(TokenType::INTERPOLATION)) {
            end = parseInterpolationExpr();
        } else {
            expect(TokenType::STRING, "Expected end of string interpolation");
            end = std::make_unique<StringExpr>(m_previous.lexeme);
        }

        return std::make_unique<InterpolationExpr>(
                std::move(start),
                std::move(interpolated),
                std::move(end),
                std::move(token));
    }